

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_windowing.cc
# Opt level: O1

bool __thiscall
sptk::DataWindowing::Run
          (DataWindowing *this,vector<double,_std::allocator<double>_> *data,
          vector<double,_std::allocator<double>_> *windowed_data)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if ((windowed_data != (vector<double,_std::allocator<double>_> *)0x0) &&
       (bVar5 = false,
       (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == (long)this->input_length_)) {
      if ((long)(windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->output_length_) {
        std::vector<double,_std::allocator<double>_>::resize
                  (windowed_data,(long)this->output_length_);
      }
      lVar4 = (long)this->input_length_;
      pdVar1 = (windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (lVar4 != 0) {
        pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->window_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = 0;
        do {
          *(double *)((long)pdVar1 + lVar6) =
               *(double *)((long)pdVar2 + lVar6) * *(double *)((long)pdVar3 + lVar6);
          lVar6 = lVar6 + 8;
        } while (lVar4 * 8 - lVar6 != 0);
      }
      pdVar1 = pdVar1 + lVar4;
      pdVar2 = (windowed_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar5 = true;
      if (pdVar1 != pdVar2) {
        memset(pdVar1,0,((long)pdVar2 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool DataWindowing::Run(const std::vector<double>& data,
                        std::vector<double>* windowed_data) const {
  // Check inputs.
  if (!is_valid_ || data.size() != static_cast<std::size_t>(input_length_) ||
      NULL == windowed_data) {
    return false;
  }

  // Prepare memories.
  if (windowed_data->size() != static_cast<std::size_t>(output_length_)) {
    windowed_data->resize(output_length_);
  }

  // Apply window.
  std::transform(data.begin(), data.begin() + input_length_, window_.begin(),
                 windowed_data->begin(),
                 [](double x, double w) { return x * w; });

  // Fill zero.
  std::fill(windowed_data->begin() + input_length_, windowed_data->end(), 0.0);

  return true;
}